

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_value * jx9VmExtractVariable(jx9_vm *pVm,SyString *pVar)

{
  jx9_value *pValue;
  SyString *pVar_local;
  jx9_vm *pVm_local;
  
  if (pVm->nMagic == 0xcdfe1dad) {
    pVm_local = (jx9_vm *)VmExtractMemObj(pVm,pVar,0,0);
  }
  else {
    pVm_local = (jx9_vm *)0x0;
  }
  return (jx9_value *)pVm_local;
}

Assistant:

JX9_PRIVATE jx9_value * jx9VmExtractVariable(jx9_vm *pVm,SyString *pVar)
{
	jx9_value *pValue;
	if( pVm->nMagic != JX9_VM_EXEC ){
		/* call jx9_vm_exec() first */
		return 0;
	}
	/* Perform the lookup */
	pValue = VmExtractMemObj(pVm,pVar,FALSE,FALSE);
	/* Lookup result */
	return pValue;
}